

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

SymbolVisibility __thiscall google::protobuf::Symbol::GetEffectiveVisibility(Symbol *this)

{
  byte bVar1;
  int iVar2;
  SymbolBase *pSVar3;
  SymbolVisibility SVar4;
  FeatureSet *pFVar5;
  long lVar6;
  
  pSVar3 = this->ptr_;
  if (pSVar3->symbol_type_ == '\x04') {
    bVar1 = pSVar3[1].symbol_type_ >> 2;
  }
  else {
    if (pSVar3->symbol_type_ != '\x01') {
      return VISIBILITY_UNSET;
    }
    bVar1 = pSVar3[2].symbol_type_;
  }
  SVar4 = bVar1 & (VISIBILITY_EXPORT|VISIBILITY_LOCAL);
  if ((bVar1 & 3) == 0) {
    pFVar5 = features(this);
    iVar2 = (pFVar5->field_0)._impl_.default_symbol_visibility_;
    if (iVar2 - 3U < 2) {
      SVar4 = VISIBILITY_LOCAL;
    }
    else {
      SVar4 = VISIBILITY_EXPORT;
      if (iVar2 != 1) {
        if (iVar2 != 2) {
          GetEffectiveVisibility();
        }
        bVar1 = this->ptr_->symbol_type_;
        lVar6 = 0x20;
        if (1 < bVar1 - 1) {
          if (bVar1 != 4) {
            return VISIBILITY_EXPORT;
          }
          lVar6 = 0x18;
        }
        SVar4 = (*(long *)(this->ptr_ + lVar6) == 0) + VISIBILITY_LOCAL;
      }
    }
  }
  return SVar4;
}

Assistant:

SymbolVisibility GetEffectiveVisibility() const {
    // Only Types have visibility
    if (!IsType()) {
      return SymbolVisibility::VISIBILITY_UNSET;
    }

    SymbolVisibility effective_visibility = visibility_keyword();

    // If our visibility is specifically set we can return that.  We'll validate
    // whether it's reasonable or not later.
    if (effective_visibility == SymbolVisibility::VISIBILITY_UNSET) {
      switch (features().default_symbol_visibility()) {
        case FeatureSet::VisibilityFeature::EXPORT_ALL:
          return SymbolVisibility::VISIBILITY_EXPORT;
        case FeatureSet::VisibilityFeature::EXPORT_TOP_LEVEL:
          return IsNestedDefinition() ? SymbolVisibility::VISIBILITY_LOCAL
                                      : SymbolVisibility::VISIBILITY_EXPORT;
        case FeatureSet::VisibilityFeature::LOCAL_ALL:
        case FeatureSet::VisibilityFeature::STRICT:
          return SymbolVisibility::VISIBILITY_LOCAL;

        // Unset shouldn't be possible from the compiler without there being an
        // error (recursive import, for example), but happens in unit
        // tests so assume it represents pre-edition 2024 defaults. In either
        // case we want to fail open.  We have a DCHECK here to make sure it can
        // fail in tests, but not released code.
        case FeatureSet::VisibilityFeature::DEFAULT_SYMBOL_VISIBILITY_UNKNOWN:
        default:
          ABSL_DCHECK(false);
          return SymbolVisibility::VISIBILITY_EXPORT;
      }
    }

    return effective_visibility;
  }